

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void do_gvec_shifts(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   TCGv_i32 shift,uint32_t oprsz,uint32_t maxsz,GVecGen2sh_conflict9 *g)

{
  _Bool _Var1;
  TCGType_conflict TVar2;
  uint uVar3;
  uint32_t arg2;
  TCGOpcode *pTVar4;
  TCGv_vec r;
  TCGv_i64 pTVar5;
  TCGv_ptr r_00;
  TCGv_ptr r_01;
  TCGv_i32 ret;
  TCGv_i32 desc;
  TCGv_ptr a1;
  TCGv_ptr a0;
  TCGv_i64 sh64_1;
  TCGv_i64 sh64;
  TCGv_vec v_shift;
  TCGOpcode *hold_list_1;
  TCGOpcode *hold_list;
  uint32_t some;
  TCGType_conflict type;
  uint32_t oprsz_local;
  TCGv_i32 shift_local;
  uint32_t local_18;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  check_size_align(oprsz,maxsz,dofs | aofs);
  check_overlap_2(dofs,aofs,maxsz);
  TVar2 = choose_vector_type(tcg_ctx,g->s_list,vece,oprsz,vece == 3);
  some = oprsz;
  shift_local._4_4_ = aofs;
  local_18 = dofs;
  if (TVar2 == TCG_TYPE_I32) {
    TVar2 = choose_vector_type(tcg_ctx,g->v_list,vece,oprsz,vece == 3);
    if (TVar2 == TCG_TYPE_I32) {
      if ((vece == 2) && (_Var1 = check_size_impl(oprsz,4), _Var1)) {
        expand_2s_i32(tcg_ctx,dofs,aofs,oprsz,shift,false,g->fni4);
      }
      else {
        if ((vece != 3) || (_Var1 = check_size_impl(oprsz,8), !_Var1)) {
          r_00 = tcg_temp_new_ptr(tcg_ctx);
          r_01 = tcg_temp_new_ptr(tcg_ctx);
          ret = tcg_temp_new_i32(tcg_ctx);
          tcg_gen_shli_i32_tricore(tcg_ctx,ret,shift,10);
          arg2 = simd_desc_tricore(oprsz,maxsz,0);
          tcg_gen_ori_i32_tricore(tcg_ctx,ret,ret,arg2);
          tcg_gen_addi_ptr(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)dofs);
          tcg_gen_addi_ptr(tcg_ctx,r_01,tcg_ctx->cpu_env,(ulong)aofs);
          (*g->fno[vece])(tcg_ctx,r_00,r_01,ret);
          tcg_temp_free_ptr(tcg_ctx,r_00);
          tcg_temp_free_ptr(tcg_ctx,r_01);
          tcg_temp_free_i32(tcg_ctx,ret);
          return;
        }
        pTVar5 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64_tricore(tcg_ctx,pTVar5,shift);
        expand_2s_i64(tcg_ctx,dofs,aofs,oprsz,pTVar5,false,g->fni8);
        tcg_temp_free_i64(tcg_ctx,pTVar5);
      }
      goto LAB_0134e2ab;
    }
    pTVar4 = tcg_swap_vecop_list((TCGOpcode *)0x0);
    r = tcg_temp_new_vec_tricore(tcg_ctx,TVar2);
    if (vece == 3) {
      pTVar5 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_extu_i32_i64_tricore(tcg_ctx,pTVar5,shift);
      tcg_gen_dup_i64_vec_tricore(tcg_ctx,3,r,pTVar5);
      tcg_temp_free_i64(tcg_ctx,pTVar5);
    }
    else {
      tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r,shift);
    }
    if (TVar2 == TCG_TYPE_V64) {
      expand_2s_vec(tcg_ctx,vece,dofs,aofs,oprsz,8,TCG_TYPE_V64,r,false,g->fniv_v);
    }
    else {
      if (TVar2 != TCG_TYPE_V128) {
        if (TVar2 != TCG_TYPE_V256) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                     ,0xace,(char *)0x0);
        }
        uVar3 = oprsz & 0xffffffe0;
        expand_2s_vec(tcg_ctx,vece,dofs,aofs,uVar3,0x20,TCG_TYPE_V256,r,false,g->fniv_v);
        if (uVar3 == oprsz) goto LAB_0134e0da;
        local_18 = uVar3 + dofs;
        shift_local._4_4_ = uVar3 + aofs;
        some = oprsz - uVar3;
        maxsz = maxsz - uVar3;
      }
      expand_2s_vec(tcg_ctx,vece,local_18,shift_local._4_4_,some,0x10,TCG_TYPE_V128,r,false,
                    g->fniv_v);
    }
LAB_0134e0da:
    tcg_temp_free_vec(tcg_ctx,r);
    tcg_swap_vecop_list(pTVar4);
    goto LAB_0134e2ab;
  }
  pTVar4 = tcg_swap_vecop_list((TCGOpcode *)0x0);
  if (TVar2 == TCG_TYPE_V64) {
    expand_2sh_vec(tcg_ctx,vece,dofs,aofs,oprsz,8,TCG_TYPE_V64,shift,g->fniv_s);
  }
  else {
    if (TVar2 != TCG_TYPE_V128) {
      if (TVar2 != TCG_TYPE_V256) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                   ,0xaa3,(char *)0x0);
      }
      uVar3 = oprsz & 0xffffffe0;
      expand_2sh_vec(tcg_ctx,vece,dofs,aofs,uVar3,0x20,TCG_TYPE_V256,shift,g->fniv_s);
      if (uVar3 == oprsz) goto LAB_0134deca;
      local_18 = uVar3 + dofs;
      shift_local._4_4_ = uVar3 + aofs;
      some = oprsz - uVar3;
      maxsz = maxsz - uVar3;
    }
    expand_2sh_vec(tcg_ctx,vece,local_18,shift_local._4_4_,some,0x10,TCG_TYPE_V128,shift,g->fniv_s);
  }
LAB_0134deca:
  tcg_swap_vecop_list(pTVar4);
LAB_0134e2ab:
  if (some < maxsz) {
    expand_clr(tcg_ctx,local_18 + some,maxsz - some);
  }
  return;
}

Assistant:

static void
do_gvec_shifts(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs, TCGv_i32 shift,
               uint32_t oprsz, uint32_t maxsz, const GVecGen2sh *g)
{
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    /* If the backend has a scalar expansion, great.  */
    type = choose_vector_type(tcg_ctx, g->s_list, vece, oprsz, vece == MO_64);
    if (type) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        switch (type) {
        case TCG_TYPE_V256:
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, some, 32,
                           TCG_TYPE_V256, shift, g->fniv_s);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */
        case TCG_TYPE_V128:
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, oprsz, 16,
                           TCG_TYPE_V128, shift, g->fniv_s);
            break;
        case TCG_TYPE_V64:
            expand_2sh_vec(tcg_ctx, vece, dofs, aofs, oprsz, 8,
                           TCG_TYPE_V64, shift, g->fniv_s);
            break;
        default:
            g_assert_not_reached();
        }
        tcg_swap_vecop_list(hold_list);
        goto clear_tail;
    }

    /* If the backend supports variable vector shifts, also cool.  */
    type = choose_vector_type(tcg_ctx, g->v_list, vece, oprsz, vece == MO_64);
    if (type) {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        TCGv_vec v_shift = tcg_temp_new_vec(tcg_ctx, type);

        if (vece == MO_64) {
            TCGv_i64 sh64 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_extu_i32_i64(tcg_ctx, sh64, shift);
            tcg_gen_dup_i64_vec(tcg_ctx, MO_64, v_shift, sh64);
            tcg_temp_free_i64(tcg_ctx, sh64);
        } else {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, v_shift, shift);
        }

        switch (type) {
        case TCG_TYPE_V256:
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                          v_shift, false, g->fniv_v);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */
        case TCG_TYPE_V128:
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                          v_shift, false, g->fniv_v);
            break;
        case TCG_TYPE_V64:
            expand_2s_vec(tcg_ctx, vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                          v_shift, false, g->fniv_v);
            break;
        default:
            g_assert_not_reached();
        }
        tcg_temp_free_vec(tcg_ctx, v_shift);
        tcg_swap_vecop_list(hold_list);
        goto clear_tail;
    }

    /* Otherwise fall back to integral... */
    if (vece == MO_32 && check_size_impl(oprsz, 4)) {
        expand_2s_i32(tcg_ctx, dofs, aofs, oprsz, shift, false, g->fni4);
    } else if (vece == MO_64 && check_size_impl(oprsz, 8)) {
        TCGv_i64 sh64 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, sh64, shift);
        expand_2s_i64(tcg_ctx, dofs, aofs, oprsz, sh64, false, g->fni8);
        tcg_temp_free_i64(tcg_ctx, sh64);
    } else {
        TCGv_ptr a0 = tcg_temp_new_ptr(tcg_ctx);
        TCGv_ptr a1 = tcg_temp_new_ptr(tcg_ctx);
        TCGv_i32 desc = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_shli_i32(tcg_ctx, desc, shift, SIMD_DATA_SHIFT);
        tcg_gen_ori_i32(tcg_ctx, desc, desc, simd_desc(oprsz, maxsz, 0));
        tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
        tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);

        g->fno[vece](tcg_ctx, a0, a1, desc);

        tcg_temp_free_ptr(tcg_ctx, a0);
        tcg_temp_free_ptr(tcg_ctx, a1);
        tcg_temp_free_i32(tcg_ctx, desc);
        return;
    }

 clear_tail:
    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}